

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.hpp
# Opt level: O0

void __thiscall tcu::Resource::~Resource(Resource *this)

{
  Resource *this_local;
  
  this->_vptr_Resource = (_func_int **)&PTR__Resource_011e8970;
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

virtual				~Resource		(void) {}